

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_map.c
# Opt level: O0

int map_contains(map m,map_key key)

{
  comparable_callback compare_cb;
  pair ppVar1;
  bucket in_RSI;
  long in_RDI;
  pair p;
  bucket b;
  size_t index;
  map_hash hash;
  
  if ((in_RDI != 0) && (in_RSI != (bucket)0x0)) {
    compare_cb = (comparable_callback)(**(code **)(in_RDI + 0x20))(in_RSI);
    ppVar1 = bucket_get_pair(in_RSI,compare_cb,(void *)((ulong)compare_cb % *(ulong *)(in_RDI + 8)))
    ;
    if (ppVar1 != (pair)0x0) {
      return 0;
    }
  }
  return 1;
}

Assistant:

int map_contains(map m, map_key key)
{
	if (m != NULL && key != NULL)
	{
		map_hash hash = m->hash_cb(key);

		size_t index = hash % m->capacity;

		bucket b = &m->buckets[index];

		pair p = bucket_get_pair(b, m->compare_cb, key);

		if (p != NULL)
		{
			return 0;
		}
	}

	return 1;
}